

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

int main(void)

{
  _Bool _Var1;
  void *pvVar2;
  void *ptr;
  int8_t r_8;
  uint8_t r_7;
  int16_t r_6;
  uint16_t r_5;
  int32_t r_4;
  uint32_t r_3;
  int64_t r_2;
  uint64_t r_1;
  size_t r;
  
  r._4_4_ = 0;
  _Var1 = chck_add_ofsz(1,0xffffffffffffffff,&r_1);
  if (!_Var1) {
    __assert_fail("chck_add_ofsz(1, (18446744073709551615UL), &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1b,"int main(void)");
  }
  _Var1 = chck_add_ofsz(0xffffffffffffffff,1,&r_1);
  if (!_Var1) {
    __assert_fail("chck_add_ofsz((18446744073709551615UL), 1, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1b,"int main(void)");
  }
  _Var1 = chck_sub_ofsz(0,0xffffffffffffffff,&r_1);
  if (!_Var1) {
    __assert_fail("chck_sub_ofsz(((size_t)~0 == (18446744073709551615UL) ? 0 : -2), (18446744073709551615UL), &r)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1b,"int main(void)");
  }
  _Var1 = chck_mul_ofsz(3,0xffffffffffffffff,&r_1);
  if (!_Var1) {
    __assert_fail("chck_mul_ofsz(3, (18446744073709551615UL), &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1b,"int main(void)");
  }
  _Var1 = chck_mul_ofsz(0xfffffffffffffffd,0xffffffffffffffff,&r_1);
  if (!_Var1) {
    __assert_fail("chck_mul_ofsz(-3, (18446744073709551615UL), &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1b,"int main(void)");
  }
  _Var1 = chck_add_ofsz(4,4,&r_1);
  if (_Var1) {
    __assert_fail("!chck_add_ofsz(4, 4, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1b,"int main(void)");
  }
  _Var1 = chck_sub_ofsz(8,4,&r_1);
  if (_Var1) {
    __assert_fail("!chck_sub_ofsz(8, 4, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1b,"int main(void)");
  }
  _Var1 = chck_mul_ofsz(5,5,&r_1);
  if (_Var1) {
    __assert_fail("!chck_mul_ofsz(5, 5, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1b,"int main(void)");
  }
  _Var1 = chck_add_ofsz(0xffffffffffffffff,0,&r_1);
  if (_Var1) {
    __assert_fail("!chck_add_ofsz((18446744073709551615UL), 0, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1b,"int main(void)");
  }
  _Var1 = chck_sub_ofsz(0xffffffffffffffff,0,&r_1);
  if (_Var1) {
    __assert_fail("!chck_sub_ofsz((18446744073709551615UL), 0, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1b,"int main(void)");
  }
  _Var1 = chck_mul_ofsz(0xffffffffffffffff,0,&r_1);
  if (_Var1) {
    __assert_fail("!chck_mul_ofsz((18446744073709551615UL), 0, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1b,"int main(void)");
  }
  _Var1 = chck_add_ofu64(1,0xffffffffffffffff,(uint64_t *)&r_2);
  if (!_Var1) {
    __assert_fail("chck_add_ofu64(1, (18446744073709551615UL), &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1c,"int main(void)");
  }
  _Var1 = chck_add_ofu64(0xffffffffffffffff,1,(uint64_t *)&r_2);
  if (!_Var1) {
    __assert_fail("chck_add_ofu64((18446744073709551615UL), 1, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1c,"int main(void)");
  }
  _Var1 = chck_sub_ofu64(0,0xffffffffffffffff,(uint64_t *)&r_2);
  if (!_Var1) {
    __assert_fail("chck_sub_ofu64(((uint64_t)~0 == (18446744073709551615UL) ? 0 : -2), (18446744073709551615UL), &r)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1c,"int main(void)");
  }
  _Var1 = chck_mul_ofu64(3,0xffffffffffffffff,(uint64_t *)&r_2);
  if (!_Var1) {
    __assert_fail("chck_mul_ofu64(3, (18446744073709551615UL), &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1c,"int main(void)");
  }
  _Var1 = chck_mul_ofu64(0xfffffffffffffffd,0xffffffffffffffff,(uint64_t *)&r_2);
  if (!_Var1) {
    __assert_fail("chck_mul_ofu64(-3, (18446744073709551615UL), &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1c,"int main(void)");
  }
  _Var1 = chck_add_ofu64(4,4,(uint64_t *)&r_2);
  if (_Var1) {
    __assert_fail("!chck_add_ofu64(4, 4, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1c,"int main(void)");
  }
  _Var1 = chck_sub_ofu64(8,4,(uint64_t *)&r_2);
  if (_Var1) {
    __assert_fail("!chck_sub_ofu64(8, 4, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1c,"int main(void)");
  }
  _Var1 = chck_mul_ofu64(5,5,(uint64_t *)&r_2);
  if (_Var1) {
    __assert_fail("!chck_mul_ofu64(5, 5, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1c,"int main(void)");
  }
  _Var1 = chck_add_ofu64(0xffffffffffffffff,0,(uint64_t *)&r_2);
  if (_Var1) {
    __assert_fail("!chck_add_ofu64((18446744073709551615UL), 0, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1c,"int main(void)");
  }
  _Var1 = chck_sub_ofu64(0xffffffffffffffff,0,(uint64_t *)&r_2);
  if (_Var1) {
    __assert_fail("!chck_sub_ofu64((18446744073709551615UL), 0, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1c,"int main(void)");
  }
  _Var1 = chck_mul_ofu64(0xffffffffffffffff,0,(uint64_t *)&r_2);
  if (_Var1) {
    __assert_fail("!chck_mul_ofu64((18446744073709551615UL), 0, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1c,"int main(void)");
  }
  _Var1 = chck_add_of64(1,0x7fffffffffffffff,(int64_t *)&r_4);
  if (!_Var1) {
    __assert_fail("chck_add_of64(1, (9223372036854775807L), &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1d,"int main(void)");
  }
  _Var1 = chck_add_of64(0x7fffffffffffffff,1,(int64_t *)&r_4);
  if (!_Var1) {
    __assert_fail("chck_add_of64((9223372036854775807L), 1, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1d,"int main(void)");
  }
  _Var1 = chck_sub_of64(-2,0x7fffffffffffffff,(int64_t *)&r_4);
  if (!_Var1) {
    __assert_fail("chck_sub_of64(((int64_t)~0 == (9223372036854775807L) ? 0 : -2), (9223372036854775807L), &r)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1d,"int main(void)");
  }
  _Var1 = chck_mul_of64(3,0x7fffffffffffffff,(int64_t *)&r_4);
  if (!_Var1) {
    __assert_fail("chck_mul_of64(3, (9223372036854775807L), &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1d,"int main(void)");
  }
  _Var1 = chck_mul_of64(-3,0x7fffffffffffffff,(int64_t *)&r_4);
  if (!_Var1) {
    __assert_fail("chck_mul_of64(-3, (9223372036854775807L), &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1d,"int main(void)");
  }
  _Var1 = chck_add_of64(4,4,(int64_t *)&r_4);
  if (_Var1) {
    __assert_fail("!chck_add_of64(4, 4, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1d,"int main(void)");
  }
  _Var1 = chck_sub_of64(8,4,(int64_t *)&r_4);
  if (_Var1) {
    __assert_fail("!chck_sub_of64(8, 4, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1d,"int main(void)");
  }
  _Var1 = chck_mul_of64(5,5,(int64_t *)&r_4);
  if (_Var1) {
    __assert_fail("!chck_mul_of64(5, 5, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1d,"int main(void)");
  }
  _Var1 = chck_add_of64(0x7fffffffffffffff,0,(int64_t *)&r_4);
  if (_Var1) {
    __assert_fail("!chck_add_of64((9223372036854775807L), 0, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1d,"int main(void)");
  }
  _Var1 = chck_sub_of64(0x7fffffffffffffff,0,(int64_t *)&r_4);
  if (_Var1) {
    __assert_fail("!chck_sub_of64((9223372036854775807L), 0, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1d,"int main(void)");
  }
  _Var1 = chck_mul_of64(0x7fffffffffffffff,0,(int64_t *)&r_4);
  if (_Var1) {
    __assert_fail("!chck_mul_of64((9223372036854775807L), 0, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1d,"int main(void)");
  }
  _Var1 = chck_add_ofu32(1,0xffffffff,(uint32_t *)&r_6);
  if (!_Var1) {
    __assert_fail("chck_add_ofu32(1, (4294967295U), &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1e,"int main(void)");
  }
  _Var1 = chck_add_ofu32(0xffffffff,1,(uint32_t *)&r_6);
  if (!_Var1) {
    __assert_fail("chck_add_ofu32((4294967295U), 1, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1e,"int main(void)");
  }
  _Var1 = chck_sub_ofu32(0,0xffffffff,(uint32_t *)&r_6);
  if (!_Var1) {
    __assert_fail("chck_sub_ofu32(((uint32_t)~0 == (4294967295U) ? 0 : -2), (4294967295U), &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1e,"int main(void)");
  }
  _Var1 = chck_mul_ofu32(3,0xffffffff,(uint32_t *)&r_6);
  if (!_Var1) {
    __assert_fail("chck_mul_ofu32(3, (4294967295U), &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1e,"int main(void)");
  }
  _Var1 = chck_mul_ofu32(0xfffffffd,0xffffffff,(uint32_t *)&r_6);
  if (!_Var1) {
    __assert_fail("chck_mul_ofu32(-3, (4294967295U), &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1e,"int main(void)");
  }
  _Var1 = chck_add_ofu32(4,4,(uint32_t *)&r_6);
  if (_Var1) {
    __assert_fail("!chck_add_ofu32(4, 4, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1e,"int main(void)");
  }
  _Var1 = chck_sub_ofu32(8,4,(uint32_t *)&r_6);
  if (_Var1) {
    __assert_fail("!chck_sub_ofu32(8, 4, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1e,"int main(void)");
  }
  _Var1 = chck_mul_ofu32(5,5,(uint32_t *)&r_6);
  if (_Var1) {
    __assert_fail("!chck_mul_ofu32(5, 5, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1e,"int main(void)");
  }
  _Var1 = chck_add_ofu32(0xffffffff,0,(uint32_t *)&r_6);
  if (_Var1) {
    __assert_fail("!chck_add_ofu32((4294967295U), 0, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1e,"int main(void)");
  }
  _Var1 = chck_sub_ofu32(0xffffffff,0,(uint32_t *)&r_6);
  if (_Var1) {
    __assert_fail("!chck_sub_ofu32((4294967295U), 0, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1e,"int main(void)");
  }
  _Var1 = chck_mul_ofu32(0xffffffff,0,(uint32_t *)&r_6);
  if (_Var1) {
    __assert_fail("!chck_mul_ofu32((4294967295U), 0, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1e,"int main(void)");
  }
  _Var1 = chck_add_of32(1,0x7fffffff,(int32_t *)&stack0xffffffffffffffd0);
  if (!_Var1) {
    __assert_fail("chck_add_of32(1, (2147483647), &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1f,"int main(void)");
  }
  _Var1 = chck_add_of32(0x7fffffff,1,(int32_t *)&stack0xffffffffffffffd0);
  if (!_Var1) {
    __assert_fail("chck_add_of32((2147483647), 1, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1f,"int main(void)");
  }
  _Var1 = chck_sub_of32(-2,0x7fffffff,(int32_t *)&stack0xffffffffffffffd0);
  if (!_Var1) {
    __assert_fail("chck_sub_of32(((int32_t)~0 == (2147483647) ? 0 : -2), (2147483647), &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1f,"int main(void)");
  }
  _Var1 = chck_mul_of32(3,0x7fffffff,(int32_t *)&stack0xffffffffffffffd0);
  if (!_Var1) {
    __assert_fail("chck_mul_of32(3, (2147483647), &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1f,"int main(void)");
  }
  _Var1 = chck_mul_of32(-3,0x7fffffff,(int32_t *)&stack0xffffffffffffffd0);
  if (!_Var1) {
    __assert_fail("chck_mul_of32(-3, (2147483647), &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1f,"int main(void)");
  }
  _Var1 = chck_add_of32(4,4,(int32_t *)&stack0xffffffffffffffd0);
  if (_Var1) {
    __assert_fail("!chck_add_of32(4, 4, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1f,"int main(void)");
  }
  _Var1 = chck_sub_of32(8,4,(int32_t *)&stack0xffffffffffffffd0);
  if (_Var1) {
    __assert_fail("!chck_sub_of32(8, 4, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1f,"int main(void)");
  }
  _Var1 = chck_mul_of32(5,5,(int32_t *)&stack0xffffffffffffffd0);
  if (_Var1) {
    __assert_fail("!chck_mul_of32(5, 5, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1f,"int main(void)");
  }
  _Var1 = chck_add_of32(0x7fffffff,0,(int32_t *)&stack0xffffffffffffffd0);
  if (_Var1) {
    __assert_fail("!chck_add_of32((2147483647), 0, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1f,"int main(void)");
  }
  _Var1 = chck_sub_of32(0x7fffffff,0,(int32_t *)&stack0xffffffffffffffd0);
  if (_Var1) {
    __assert_fail("!chck_sub_of32((2147483647), 0, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1f,"int main(void)");
  }
  _Var1 = chck_mul_of32(0x7fffffff,0,(int32_t *)&stack0xffffffffffffffd0);
  if (_Var1) {
    __assert_fail("!chck_mul_of32((2147483647), 0, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x1f,"int main(void)");
  }
  _Var1 = chck_add_ofu16(1,0xffff,(uint16_t *)((long)&ptr + 6));
  if (!_Var1) {
    __assert_fail("chck_add_ofu16(1, (65535), &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x20,"int main(void)");
  }
  _Var1 = chck_add_ofu16(0xffff,1,(uint16_t *)((long)&ptr + 6));
  if (!_Var1) {
    __assert_fail("chck_add_ofu16((65535), 1, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x20,"int main(void)");
  }
  _Var1 = chck_sub_ofu16(0,0xffff,(uint16_t *)((long)&ptr + 6));
  if (!_Var1) {
    __assert_fail("chck_sub_ofu16(((uint16_t)~0 == (65535) ? 0 : -2), (65535), &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x20,"int main(void)");
  }
  _Var1 = chck_mul_ofu16(3,0xffff,(uint16_t *)((long)&ptr + 6));
  if (!_Var1) {
    __assert_fail("chck_mul_ofu16(3, (65535), &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x20,"int main(void)");
  }
  _Var1 = chck_mul_ofu16(0xfffd,0xffff,(uint16_t *)((long)&ptr + 6));
  if (!_Var1) {
    __assert_fail("chck_mul_ofu16(-3, (65535), &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x20,"int main(void)");
  }
  _Var1 = chck_add_ofu16(4,4,(uint16_t *)((long)&ptr + 6));
  if (_Var1) {
    __assert_fail("!chck_add_ofu16(4, 4, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x20,"int main(void)");
  }
  _Var1 = chck_sub_ofu16(8,4,(uint16_t *)((long)&ptr + 6));
  if (_Var1) {
    __assert_fail("!chck_sub_ofu16(8, 4, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x20,"int main(void)");
  }
  _Var1 = chck_mul_ofu16(5,5,(uint16_t *)((long)&ptr + 6));
  if (_Var1) {
    __assert_fail("!chck_mul_ofu16(5, 5, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x20,"int main(void)");
  }
  _Var1 = chck_add_ofu16(0xffff,0,(uint16_t *)((long)&ptr + 6));
  if (!_Var1) {
    _Var1 = chck_sub_ofu16(0xffff,0,(uint16_t *)((long)&ptr + 6));
    if (_Var1) {
      __assert_fail("!chck_sub_ofu16((65535), 0, &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x20,"int main(void)");
    }
    _Var1 = chck_mul_ofu16(0xffff,0,(uint16_t *)((long)&ptr + 6));
    if (_Var1) {
      __assert_fail("!chck_mul_ofu16((65535), 0, &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x20,"int main(void)");
    }
    _Var1 = chck_add_of16(1,0x7fff,(int16_t *)((long)&ptr + 4));
    if (!_Var1) {
      __assert_fail("chck_add_of16(1, (32767), &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x21,"int main(void)");
    }
    _Var1 = chck_add_of16(0x7fff,1,(int16_t *)((long)&ptr + 4));
    if (!_Var1) {
      __assert_fail("chck_add_of16((32767), 1, &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x21,"int main(void)");
    }
    _Var1 = chck_sub_of16(-2,0x7fff,(int16_t *)((long)&ptr + 4));
    if (!_Var1) {
      __assert_fail("chck_sub_of16(((int16_t)~0 == (32767) ? 0 : -2), (32767), &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x21,"int main(void)");
    }
    _Var1 = chck_mul_of16(3,0x7fff,(int16_t *)((long)&ptr + 4));
    if (!_Var1) {
      __assert_fail("chck_mul_of16(3, (32767), &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x21,"int main(void)");
    }
    _Var1 = chck_mul_of16(-3,0x7fff,(int16_t *)((long)&ptr + 4));
    if (!_Var1) {
      __assert_fail("chck_mul_of16(-3, (32767), &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x21,"int main(void)");
    }
    _Var1 = chck_add_of16(4,4,(int16_t *)((long)&ptr + 4));
    if (_Var1) {
      __assert_fail("!chck_add_of16(4, 4, &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x21,"int main(void)");
    }
    _Var1 = chck_sub_of16(8,4,(int16_t *)((long)&ptr + 4));
    if (_Var1) {
      __assert_fail("!chck_sub_of16(8, 4, &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x21,"int main(void)");
    }
    _Var1 = chck_mul_of16(5,5,(int16_t *)((long)&ptr + 4));
    if (_Var1) {
      __assert_fail("!chck_mul_of16(5, 5, &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x21,"int main(void)");
    }
    _Var1 = chck_add_of16(0x7fff,0,(int16_t *)((long)&ptr + 4));
    if (_Var1) {
      __assert_fail("!chck_add_of16((32767), 0, &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x21,"int main(void)");
    }
    _Var1 = chck_sub_of16(0x7fff,0,(int16_t *)((long)&ptr + 4));
    if (_Var1) {
      __assert_fail("!chck_sub_of16((32767), 0, &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x21,"int main(void)");
    }
    _Var1 = chck_mul_of16(0x7fff,0,(int16_t *)((long)&ptr + 4));
    if (_Var1) {
      __assert_fail("!chck_mul_of16((32767), 0, &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x21,"int main(void)");
    }
    _Var1 = chck_add_ofu8('\x01',0xff,(uint8_t *)((long)&ptr + 3));
    if (!_Var1) {
      __assert_fail("chck_add_ofu8(1, (255), &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x22,"int main(void)");
    }
    _Var1 = chck_add_ofu8(0xff,'\x01',(uint8_t *)((long)&ptr + 3));
    if (!_Var1) {
      __assert_fail("chck_add_ofu8((255), 1, &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x22,"int main(void)");
    }
    _Var1 = chck_sub_ofu8('\0',0xff,(uint8_t *)((long)&ptr + 3));
    if (!_Var1) {
      __assert_fail("chck_sub_ofu8(((uint8_t)~0 == (255) ? 0 : -2), (255), &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x22,"int main(void)");
    }
    _Var1 = chck_mul_ofu8('\x03',0xff,(uint8_t *)((long)&ptr + 3));
    if (!_Var1) {
      __assert_fail("chck_mul_ofu8(3, (255), &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x22,"int main(void)");
    }
    _Var1 = chck_mul_ofu8(0xfd,0xff,(uint8_t *)((long)&ptr + 3));
    if (!_Var1) {
      __assert_fail("chck_mul_ofu8(-3, (255), &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x22,"int main(void)");
    }
    _Var1 = chck_add_ofu8('\x04','\x04',(uint8_t *)((long)&ptr + 3));
    if (_Var1) {
      __assert_fail("!chck_add_ofu8(4, 4, &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x22,"int main(void)");
    }
    _Var1 = chck_sub_ofu8('\b','\x04',(uint8_t *)((long)&ptr + 3));
    if (_Var1) {
      __assert_fail("!chck_sub_ofu8(8, 4, &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x22,"int main(void)");
    }
    _Var1 = chck_mul_ofu8('\x05','\x05',(uint8_t *)((long)&ptr + 3));
    if (_Var1) {
      __assert_fail("!chck_mul_ofu8(5, 5, &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x22,"int main(void)");
    }
    _Var1 = chck_add_ofu8(0xff,'\0',(uint8_t *)((long)&ptr + 3));
    if (_Var1) {
      __assert_fail("!chck_add_ofu8((255), 0, &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x22,"int main(void)");
    }
    _Var1 = chck_sub_ofu8(0xff,'\0',(uint8_t *)((long)&ptr + 3));
    if (_Var1) {
      __assert_fail("!chck_sub_ofu8((255), 0, &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x22,"int main(void)");
    }
    _Var1 = chck_mul_ofu8(0xff,'\0',(uint8_t *)((long)&ptr + 3));
    if (_Var1) {
      __assert_fail("!chck_mul_ofu8((255), 0, &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x22,"int main(void)");
    }
    _Var1 = chck_add_of8('\x01','\x7f',(int8_t *)((long)&ptr + 2));
    if (!_Var1) {
      __assert_fail("chck_add_of8(1, (127), &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x23,"int main(void)");
    }
    _Var1 = chck_add_of8('\x7f','\x01',(int8_t *)((long)&ptr + 2));
    if (!_Var1) {
      __assert_fail("chck_add_of8((127), 1, &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x23,"int main(void)");
    }
    _Var1 = chck_sub_of8(-2,'\x7f',(int8_t *)((long)&ptr + 2));
    if (!_Var1) {
      __assert_fail("chck_sub_of8(((int8_t)~0 == (127) ? 0 : -2), (127), &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x23,"int main(void)");
    }
    _Var1 = chck_mul_of8('\x03','\x7f',(int8_t *)((long)&ptr + 2));
    if (!_Var1) {
      __assert_fail("chck_mul_of8(3, (127), &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x23,"int main(void)");
    }
    _Var1 = chck_mul_of8(-3,'\x7f',(int8_t *)((long)&ptr + 2));
    if (!_Var1) {
      __assert_fail("chck_mul_of8(-3, (127), &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x23,"int main(void)");
    }
    _Var1 = chck_add_of8('\x04','\x04',(int8_t *)((long)&ptr + 2));
    if (_Var1) {
      __assert_fail("!chck_add_of8(4, 4, &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x23,"int main(void)");
    }
    _Var1 = chck_sub_of8('\b','\x04',(int8_t *)((long)&ptr + 2));
    if (_Var1) {
      __assert_fail("!chck_sub_of8(8, 4, &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x23,"int main(void)");
    }
    _Var1 = chck_mul_of8('\x05','\x05',(int8_t *)((long)&ptr + 2));
    if (!_Var1) {
      _Var1 = chck_add_of8('\x7f','\0',(int8_t *)((long)&ptr + 2));
      if (_Var1) {
        __assert_fail("!chck_add_of8((127), 0, &r)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                      ,0x23,"int main(void)");
      }
      _Var1 = chck_sub_of8('\x7f','\0',(int8_t *)((long)&ptr + 2));
      if (_Var1) {
        __assert_fail("!chck_sub_of8((127), 0, &r)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                      ,0x23,"int main(void)");
      }
      _Var1 = chck_mul_of8('\x7f','\0',(int8_t *)((long)&ptr + 2));
      if (_Var1) {
        __assert_fail("!chck_mul_of8((127), 0, &r)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                      ,0x23,"int main(void)");
      }
      pvVar2 = chck_malloc_add_of(8,8);
      if (pvVar2 == (void *)0x0) {
        __assert_fail("(ptr = chck_malloc_add_of(8, 8))",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                      ,0x28,"int main(void)");
      }
      free(pvVar2);
      pvVar2 = chck_malloc_add_of(0xffffffffffffffff,8);
      if (pvVar2 != (void *)0x0) {
        __assert_fail("!(ptr = chck_malloc_add_of(SIZE_MAX, 8))",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                      ,0x29,"int main(void)");
      }
      free((void *)0x0);
      pvVar2 = chck_malloc_add_of(8,0xffffffffffffffff);
      if (pvVar2 != (void *)0x0) {
        __assert_fail("!(ptr = chck_malloc_add_of(8, SIZE_MAX))",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                      ,0x2a,"int main(void)");
      }
      free((void *)0x0);
      pvVar2 = chck_malloc_sub_of(8,4);
      if (pvVar2 == (void *)0x0) {
        __assert_fail("(ptr = chck_malloc_sub_of(8, 4))",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                      ,0x2c,"int main(void)");
      }
      free(pvVar2);
      pvVar2 = chck_malloc_sub_of(4,8);
      if (pvVar2 != (void *)0x0) {
        __assert_fail("!(ptr = chck_malloc_sub_of(4, 8))",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                      ,0x2d,"int main(void)");
      }
      free((void *)0x0);
      pvVar2 = chck_malloc_mul_of(8,8);
      if (pvVar2 == (void *)0x0) {
        __assert_fail("(ptr = chck_malloc_mul_of(8, 8))",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                      ,0x2f,"int main(void)");
      }
      free(pvVar2);
      pvVar2 = chck_malloc_mul_of(8,0xffffffffffffffff);
      if (pvVar2 != (void *)0x0) {
        __assert_fail("!(ptr = chck_malloc_mul_of(8, SIZE_MAX))",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                      ,0x30,"int main(void)");
      }
      free((void *)0x0);
      pvVar2 = chck_malloc_mul_of(0xffffffffffffffff,8);
      if (pvVar2 != (void *)0x0) {
        __assert_fail("!(ptr = chck_malloc_mul_of(SIZE_MAX, 8))",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                      ,0x31,"int main(void)");
      }
      free((void *)0x0);
      pvVar2 = chck_calloc_add_of(8,8);
      if (pvVar2 == (void *)0x0) {
        __assert_fail("(ptr = chck_calloc_add_of(8, 8))",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                      ,0x33,"int main(void)");
      }
      free(pvVar2);
      pvVar2 = chck_calloc_add_of(0xffffffffffffffff,8);
      if (pvVar2 != (void *)0x0) {
        __assert_fail("!(ptr = chck_calloc_add_of(SIZE_MAX, 8))",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                      ,0x34,"int main(void)");
      }
      free((void *)0x0);
      pvVar2 = chck_calloc_add_of(8,0xffffffffffffffff);
      if (pvVar2 != (void *)0x0) {
        __assert_fail("!(ptr = chck_calloc_add_of(8, SIZE_MAX))",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                      ,0x35,"int main(void)");
      }
      free((void *)0x0);
      pvVar2 = chck_malloc_sub_of(8,4);
      if (pvVar2 == (void *)0x0) {
        __assert_fail("(ptr = chck_malloc_sub_of(8, 4))",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                      ,0x37,"int main(void)");
      }
      free(pvVar2);
      pvVar2 = chck_malloc_sub_of(4,8);
      if (pvVar2 == (void *)0x0) {
        free((void *)0x0);
        pvVar2 = chck_calloc_of(8,8);
        if (pvVar2 == (void *)0x0) {
          __assert_fail("(ptr = chck_calloc_of(8, 8))",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                        ,0x3a,"int main(void)");
        }
        free(pvVar2);
        pvVar2 = chck_calloc_of(8,0xffffffffffffffff);
        if (pvVar2 != (void *)0x0) {
          __assert_fail("!(ptr = chck_calloc_of(8, SIZE_MAX))",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                        ,0x3b,"int main(void)");
        }
        free((void *)0x0);
        pvVar2 = chck_calloc_of(0xffffffffffffffff,8);
        if (pvVar2 != (void *)0x0) {
          __assert_fail("!(ptr = chck_calloc_of(SIZE_MAX, 8))",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                        ,0x3c,"int main(void)");
        }
        free((void *)0x0);
        pvVar2 = chck_realloc_add_of((void *)0x0,8,8);
        if (pvVar2 == (void *)0x0) {
          __assert_fail("(ptr = chck_realloc_add_of(ptr, 8, 8))",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                        ,0x3e,"int main(void)");
        }
        free(pvVar2);
        pvVar2 = chck_realloc_add_of((void *)0x0,0xffffffffffffffff,8);
        if (pvVar2 != (void *)0x0) {
          __assert_fail("!(ptr = chck_realloc_add_of(ptr, SIZE_MAX, 8))",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                        ,0x3f,"int main(void)");
        }
        free((void *)0x0);
        pvVar2 = chck_realloc_add_of((void *)0x0,8,0xffffffffffffffff);
        if (pvVar2 != (void *)0x0) {
          __assert_fail("!(ptr = chck_realloc_add_of(ptr, 8, SIZE_MAX))",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                        ,0x40,"int main(void)");
        }
        free((void *)0x0);
        pvVar2 = chck_realloc_sub_of((void *)0x0,8,4);
        if (pvVar2 == (void *)0x0) {
          __assert_fail("(ptr = chck_realloc_sub_of(ptr, 8, 4))",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                        ,0x43,"int main(void)");
        }
        free(pvVar2);
        pvVar2 = chck_realloc_sub_of((void *)0x0,4,8);
        if (pvVar2 == (void *)0x0) {
          free((void *)0x0);
          pvVar2 = chck_realloc_mul_of((void *)0x0,8,8);
          if (pvVar2 == (void *)0x0) {
            __assert_fail("(ptr = chck_realloc_mul_of(ptr, 8, 8))",
                          "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                          ,0x47,"int main(void)");
          }
          free(pvVar2);
          pvVar2 = chck_realloc_mul_of((void *)0x0,8,0xffffffffffffffff);
          if (pvVar2 == (void *)0x0) {
            free((void *)0x0);
            pvVar2 = chck_realloc_mul_of((void *)0x0,0xffffffffffffffff,8);
            if (pvVar2 == (void *)0x0) {
              free((void *)0x0);
              return 0;
            }
            __assert_fail("!(ptr = chck_realloc_mul_of(ptr, SIZE_MAX, 8))",
                          "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                          ,0x49,"int main(void)");
          }
          __assert_fail("!(ptr = chck_realloc_mul_of(ptr, 8, SIZE_MAX))",
                        "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                        ,0x48,"int main(void)");
        }
        __assert_fail("!(ptr = chck_realloc_sub_of(ptr, 4, 8))",
                      "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                      ,0x44,"int main(void)");
      }
      __assert_fail("!(ptr = chck_malloc_sub_of(4, 8))",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                    ,0x38,"int main(void)");
    }
    __assert_fail("!chck_mul_of8(5, 5, &r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                  ,0x23,"int main(void)");
  }
  __assert_fail("!chck_add_ofu16((65535), 0, &r)",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/overflow/test.c"
                ,0x20,"int main(void)");
}

Assistant:

int main(void)
{
#define test_of(T, n, s) \
   { \
      T r; \
      assert(chck_add_of##n(1, s, &r)); \
      assert(chck_add_of##n(s, 1, &r)); \
      assert(chck_sub_of##n(((T)~0 == s ? 0 : -2), s, &r)); \
      assert(chck_mul_of##n(3, s, &r)); \
      assert(chck_mul_of##n(-3, s, &r)); \
      assert(!chck_add_of##n(4, 4, &r)); \
      assert(!chck_sub_of##n(8, 4, &r)); \
      assert(!chck_mul_of##n(5, 5, &r)); \
      assert(!chck_add_of##n(s, 0, &r)); \
      assert(!chck_sub_of##n(s, 0, &r)); \
      assert(!chck_mul_of##n(s, 0, &r)); \
   }

   // TEST: overflow functions
   test_of(size_t, sz, SIZE_MAX);
   test_of(uint64_t, u64, UINT64_MAX);
   test_of(int64_t, 64, INT64_MAX);
   test_of(uint32_t, u32, UINT32_MAX);
   test_of(int32_t, 32, INT32_MAX);
   test_of(uint16_t, u16, UINT16_MAX);
   test_of(int16_t, 16, INT16_MAX);
   test_of(uint8_t, u8, UINT8_MAX);
   test_of(int8_t, 8, INT8_MAX);

   // TEST: overflow aware alloc functions
   {
      void *ptr;
      assert((ptr = chck_malloc_add_of(8, 8))); free(ptr);
      assert(!(ptr = chck_malloc_add_of(SIZE_MAX, 8))); free(ptr);
      assert(!(ptr = chck_malloc_add_of(8, SIZE_MAX))); free(ptr);

      assert((ptr = chck_malloc_sub_of(8, 4))); free(ptr);
      assert(!(ptr = chck_malloc_sub_of(4, 8))); free(ptr);

      assert((ptr = chck_malloc_mul_of(8, 8))); free(ptr);
      assert(!(ptr = chck_malloc_mul_of(8, SIZE_MAX))); free(ptr);
      assert(!(ptr = chck_malloc_mul_of(SIZE_MAX, 8))); free(ptr);

      assert((ptr = chck_calloc_add_of(8, 8))); free(ptr);
      assert(!(ptr = chck_calloc_add_of(SIZE_MAX, 8))); free(ptr);
      assert(!(ptr = chck_calloc_add_of(8, SIZE_MAX))); free(ptr);

      assert((ptr = chck_malloc_sub_of(8, 4))); free(ptr);
      assert(!(ptr = chck_malloc_sub_of(4, 8))); free(ptr);

      assert((ptr = chck_calloc_of(8, 8))); free(ptr);
      assert(!(ptr = chck_calloc_of(8, SIZE_MAX))); free(ptr);
      assert(!(ptr = chck_calloc_of(SIZE_MAX, 8))); free(ptr);

      assert((ptr = chck_realloc_add_of(ptr, 8, 8))); free(ptr); ptr = NULL;
      assert(!(ptr = chck_realloc_add_of(ptr, SIZE_MAX, 8))); free(ptr); ptr = NULL;
      assert(!(ptr = chck_realloc_add_of(ptr, 8, SIZE_MAX))); free(ptr);
      ptr = NULL;

      assert((ptr = chck_realloc_sub_of(ptr, 8, 4))); free(ptr); ptr = NULL;
      assert(!(ptr = chck_realloc_sub_of(ptr, 4, 8))); free(ptr);
      ptr = NULL;

      assert((ptr = chck_realloc_mul_of(ptr, 8, 8))); free(ptr); ptr = NULL;
      assert(!(ptr = chck_realloc_mul_of(ptr, 8, SIZE_MAX))); free(ptr); ptr = NULL;
      assert(!(ptr = chck_realloc_mul_of(ptr, SIZE_MAX, 8))); free(ptr);
   }

   return EXIT_SUCCESS;
}